

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::map_onto<long>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,long init_val,Int width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *extraout_RDX;
  Read<signed_char> RVar3;
  Write<long> local_1a8;
  Write<long> local_198;
  Read<int> local_188;
  Read<long> local_178;
  __cxx11 local_168 [32];
  __cxx11 local_148 [55];
  allocator local_111;
  string local_110 [32];
  undefined1 local_f0 [8];
  Write<signed_char> out;
  Int width_local;
  long init_val_local;
  LO nb_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  out.shared_alloc_.direct_ptr._4_4_ = width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"",&local_111);
  Write<long>::Write((Write<long> *)local_f0,nb * width,init_val,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  if (((ulong)local_f0 & 1) == 0) {
    local_60 = *(size_t *)local_f0;
  }
  else {
    local_60 = (ulong)local_f0 >> 3;
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_60 >> 3) < (int)(local_10 >> 3)) {
    if (((ulong)local_f0 & 1) == 0) {
      local_50 = *(size_t *)local_f0;
    }
    else {
      local_50 = (ulong)local_f0 >> 3;
    }
    std::__cxx11::to_string(local_148,(int)(local_50 >> 3));
    uVar1 = std::__cxx11::string::c_str();
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
    }
    std::__cxx11::to_string(local_168,(int)(local_20 >> 3));
    uVar2 = std::__cxx11::string::c_str();
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",uVar1,">=",
           uVar2);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_148);
  }
  if (((ulong)local_f0 & 1) == 0) {
    local_40 = *(size_t *)local_f0;
  }
  else {
    local_40 = (ulong)local_f0 >> 3;
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_30 >> 3) <= (int)(local_40 >> 3)) {
    Read<long>::Read(&local_178,(Read<int> *)a_data);
    Read<int>::Read(&local_188,a2b);
    Write<long>::Write(&local_198,(Write<int> *)local_f0);
    map_into<long>((Read<signed_char> *)&local_178,&local_188,(Write<signed_char> *)&local_198,
                   out.shared_alloc_.direct_ptr._4_4_);
    Write<long>::~Write(&local_198);
    Read<int>::~Read(&local_188);
    Read<long>::~Read(&local_178);
    Write<long>::Write(&local_1a8,(Write<int> *)local_f0);
    Read<long>::Read((Read<long> *)this,&local_1a8);
    Write<long>::~Write(&local_1a8);
    Write<long>::~Write((Write<long> *)local_f0);
    RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar3.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}